

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_byte.h
# Opt level: O2

void RansDecRenorm(RansState *r,uint8_t **pptr)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  bool bVar5;
  
  uVar3 = *r;
  if (uVar3 < 0x800000) {
    pbVar4 = *pptr;
    uVar2 = uVar3;
    do {
      bVar1 = *pbVar4;
      pbVar4 = pbVar4 + 1;
      uVar3 = (uint)bVar1 | uVar2 << 8;
      bVar5 = uVar2 < 0x8000;
      uVar2 = uVar3;
    } while (bVar5);
    *pptr = pbVar4;
  }
  *r = uVar3;
  return;
}

Assistant:

static inline void RansDecRenorm(RansState* r, uint8_t** pptr)
{
    // renormalize
    uint32_t x = *r;

    if (x < RANS_BYTE_L) {
        uint8_t* ptr = *pptr;
        do x = (x << 8) | *ptr++; while (x < RANS_BYTE_L);
        *pptr = ptr;
    }

    *r = x;
}